

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalBatchCopyToFile::Sink
          (PhysicalBatchCopyToFile *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  atomic<unsigned_long> *paVar1;
  FixedBatchCopyLocalState *this_00;
  ulong uVar2;
  BatchMemoryManager *this_01;
  bool bVar3;
  SinkResultType SVar4;
  int iVar5;
  idx_t iVar6;
  idx_t current_min_batch_index;
  pointer pCVar7;
  InternalException *this_02;
  ExecutionContext *pEVar8;
  FixedBatchCopyGlobalState *this_03;
  allocator local_71;
  ExecutionContext *local_70;
  FixedBatchCopyGlobalState *local_68;
  BatchMemoryManager *local_60;
  ulong local_58;
  unique_lock<std::mutex> guard;
  
  this_03 = (FixedBatchCopyGlobalState *)input->global_state;
  this_00 = (FixedBatchCopyLocalState *)input->local_state;
  local_60 = &this_03->memory_manager;
  local_70 = context;
  iVar6 = optional_idx::GetIndex(&(this_00->super_LocalSinkState).partition_info.batch_index);
  pEVar8 = local_70;
  if (this_00->current_task == PROCESSING_TASKS) {
    local_68 = (FixedBatchCopyGlobalState *)chunk;
    ExecuteTasks(this,local_70->client,(GlobalSinkState *)this_03);
    FlushBatchData(this,pEVar8->client,(GlobalSinkState *)this_03);
    if (((this_03->memory_manager).min_batch_index.super___atomic_base<unsigned_long>._M_i < iVar6)
       && (bVar3 = BatchMemoryManager::OutOfMemory(local_60,iVar6), bVar3)) {
      ::std::unique_lock<std::mutex>::unique_lock
                (&guard,&(this_03->memory_manager).super_StateWithBlockableTasks.lock);
      local_58 = (this_03->memory_manager).min_batch_index.super___atomic_base<unsigned_long>._M_i;
      if (local_58 < iVar6) {
        SVar4 = StateWithBlockableTasks::BlockSink
                          (&local_60->super_StateWithBlockableTasks,&guard,input->interrupt_state);
        pEVar8 = (ExecutionContext *)(ulong)SVar4;
      }
      ::std::unique_lock<std::mutex>::~unique_lock(&guard);
      if (local_58 < iVar6) {
        return (SinkResultType)pEVar8;
      }
    }
    this_00->current_task = SINKING_DATA;
    chunk = (DataChunk *)local_68;
  }
  if ((this_03->memory_manager).min_batch_index.super___atomic_base<unsigned_long>._M_i < iVar6) {
    current_min_batch_index =
         optional_idx::GetIndex(&(this_00->super_LocalSinkState).partition_info.min_batch_index);
    this_01 = local_60;
    local_68 = this_03;
    BatchMemoryManager::UpdateMinBatchIndex(local_60,current_min_batch_index);
    this_03 = local_68;
    bVar3 = BatchMemoryManager::OutOfMemory(this_01,iVar6);
    if (bVar3) {
      this_00->current_task = PROCESSING_TASKS;
      iVar5 = (*(this->super_PhysicalOperator)._vptr_PhysicalOperator[0x1a])
                        (this,local_70,chunk,input);
      return (SinkResultType)iVar5;
    }
  }
  if (this->write_empty_file == false) {
    FixedBatchCopyGlobalState::Initialize(this_03,local_70->client,this);
  }
  if ((this_00->collection).
      super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
      .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl ==
      (ColumnDataCollection *)0x0) {
    FixedBatchCopyLocalState::InitializeCollection
              (this_00,local_70->client,&this->super_PhysicalOperator);
    optional_idx::optional_idx((optional_idx *)&guard,iVar6);
    (this_00->batch_index).index = (idx_t)guard._M_device;
  }
  this_00->rows_copied =
       this_00->rows_copied +
       *(long *)((long)&(((FixedBatchCopyGlobalState *)chunk)->super_GlobalSinkState).
                        super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex + 8);
  pCVar7 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
           ::operator->(&this_00->collection);
  ColumnDataCollection::Append(pCVar7,&this_00->append_state,chunk);
  pCVar7 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
           ::operator->(&this_00->collection);
  iVar6 = ColumnDataCollection::AllocationSize(pCVar7);
  uVar2 = this_00->local_memory_usage;
  if (iVar6 < uVar2 || iVar6 - uVar2 == 0) {
    if (iVar6 < uVar2) {
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&guard,"PhysicalFixedBatchCopy - memory usage decreased somehow?",
                 &local_71);
      InternalException::InternalException(this_02,(string *)&guard);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    LOCK();
    paVar1 = &(this_03->memory_manager).unflushed_memory_usage;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + (iVar6 - uVar2);
    UNLOCK();
    this_00->local_memory_usage = iVar6;
  }
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalBatchCopyToFile::Sink(ExecutionContext &context, DataChunk &chunk,
                                             OperatorSinkInput &input) const {
	auto &state = input.local_state.Cast<FixedBatchCopyLocalState>();
	auto &gstate = input.global_state.Cast<FixedBatchCopyGlobalState>();
	auto &memory_manager = gstate.memory_manager;
	auto batch_index = state.partition_info.batch_index.GetIndex();
	if (state.current_task == FixedBatchCopyState::PROCESSING_TASKS) {
		ExecuteTasks(context.client, gstate);
		FlushBatchData(context.client, gstate);

		if (!memory_manager.IsMinimumBatchIndex(batch_index) && memory_manager.OutOfMemory(batch_index)) {
			auto guard = memory_manager.Lock();
			if (!memory_manager.IsMinimumBatchIndex(batch_index)) {
				// no tasks to process, we are not the minimum batch index and we have no memory available to buffer
				// block the task for now
				return memory_manager.BlockSink(guard, input.interrupt_state);
			}
		}
		state.current_task = FixedBatchCopyState::SINKING_DATA;
	}
	if (!memory_manager.IsMinimumBatchIndex(batch_index)) {
		memory_manager.UpdateMinBatchIndex(state.partition_info.min_batch_index.GetIndex());

		// we are not processing the current min batch index
		// check if we have exceeded the maximum number of unflushed rows
		if (memory_manager.OutOfMemory(batch_index)) {
			// out-of-memory - stop sinking chunks and instead assist in processing tasks for the minimum batch index
			state.current_task = FixedBatchCopyState::PROCESSING_TASKS;
			return Sink(context, chunk, input);
		}
	}
	if (!write_empty_file) {
		// if we are not writing empty files - initialize after we have received rows
		gstate.Initialize(context.client, *this);
	}
	if (!state.collection) {
		state.InitializeCollection(context.client, *this);
		state.batch_index = batch_index;
	}
	state.rows_copied += chunk.size();
	state.collection->Append(state.append_state, chunk);
	auto new_memory_usage = state.collection->AllocationSize();
	if (new_memory_usage > state.local_memory_usage) {
		// memory usage increased - add to global state
		memory_manager.IncreaseUnflushedMemory(new_memory_usage - state.local_memory_usage);
		state.local_memory_usage = new_memory_usage;
	} else if (new_memory_usage < state.local_memory_usage) {
		throw InternalException("PhysicalFixedBatchCopy - memory usage decreased somehow?");
	}
	return SinkResultType::NEED_MORE_INPUT;
}